

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O0

void __thiscall
amrex::EB2::
GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
::fillFab_Cpu(GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
              *this,BaseFab<double> *levelset,Geometry *geom,Box *bounding_box)

{
  undefined8 *in_RCX;
  CoordSys *in_RDX;
  BaseFab<double> *in_RSI;
  Array4<double> *a;
  Dim3 bhi;
  Dim3 blo;
  Box *bx;
  GpuArray<double,_3U> dx;
  GpuArray<double,_3U> problo;
  Geometry *in_stack_fffffffffffffd60;
  anon_class_48_6_13979bf4 *in_stack_fffffffffffffd98;
  Box *in_stack_fffffffffffffda0;
  GpuArray<double,_3U> local_1e8 [2];
  undefined8 *local_1b8;
  CoordSys *local_1b0;
  BaseFab<double> *local_1a8;
  undefined8 local_198;
  undefined4 local_190;
  undefined8 *local_188;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 local_174;
  undefined8 *local_170;
  undefined4 local_164;
  undefined8 *local_160;
  undefined4 local_154;
  undefined8 *local_150;
  undefined8 local_148;
  undefined4 local_140;
  undefined8 *local_138;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 *local_120;
  undefined4 local_114;
  undefined4 *local_110;
  undefined4 local_104;
  undefined8 *local_100;
  BaseFab<double> *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_1b8 = in_RCX;
  local_1b0 = in_RDX;
  local_1a8 = in_RSI;
  Geometry::ProbLoArray(in_stack_fffffffffffffd60);
  CoordSys::CellSizeArray(local_1e8,local_1b0);
  BaseFab<double>::box(local_1a8);
  local_188 = local_1b8;
  local_150 = local_1b8;
  local_154 = 0;
  local_180 = *(undefined4 *)local_1b8;
  local_160 = local_1b8;
  local_164 = 1;
  uStack_17c = *(undefined4 *)((long)local_1b8 + 4);
  local_198 = *local_1b8;
  local_170 = local_1b8;
  local_174 = 2;
  local_190 = *(undefined4 *)(local_1b8 + 1);
  local_138 = local_1b8;
  local_100 = (undefined8 *)((long)local_1b8 + 0xc);
  local_104 = 0;
  local_130 = *(undefined4 *)local_100;
  local_110 = (undefined4 *)((long)local_1b8 + 0xc);
  local_114 = 1;
  uStack_12c = *(undefined4 *)(local_1b8 + 2);
  local_148 = *local_100;
  local_120 = (undefined4 *)((long)local_1b8 + 0xc);
  local_124 = 2;
  local_140 = *(undefined4 *)((long)local_1b8 + 0x14);
  local_f8 = local_1a8;
  local_a8 = local_1a8->dptr;
  local_b0 = &local_1a8->domain;
  local_b4 = local_1a8->nvar;
  local_5c = 0;
  local_88 = (local_b0->smallend).vect[0];
  local_6c = 1;
  iStack_84 = (local_1a8->domain).smallend.vect[1];
  local_d0.x = (local_b0->smallend).vect[0];
  local_d0.y = (local_b0->smallend).vect[1];
  local_7c = 2;
  local_d0.z = (local_1a8->domain).smallend.vect[2];
  local_8 = &(local_1a8->domain).bigend;
  local_c = 0;
  local_38 = local_8->vect[0] + 1;
  local_18 = &(local_1a8->domain).bigend;
  local_1c = 1;
  iStack_34 = (local_1a8->domain).bigend.vect[1] + 1;
  local_28 = &(local_1a8->domain).bigend;
  local_2c = 2;
  local_f0.z = (local_1a8->domain).bigend.vect[2] + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_178 = local_190;
  local_128 = local_140;
  local_dc._0_8_ = local_f0._0_8_;
  local_dc.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<double>::Array4
            ((Array4<double> *)&stack0xfffffffffffffd88,local_a8,&local_c0,&local_dc,local_b4);
  LoopOnCpu<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>::fillFab_Cpu(amrex::BaseFab<double>&,amrex::Geometry_const&,amrex::Box_const&)const::_lambda(int,int,int)_1_>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  return;
}

Assistant:

void fillFab_Cpu (BaseFab<Real>& levelset, const Geometry& geom,
                      Box const& bounding_box) const noexcept
    {
        const auto problo = geom.ProbLoArray();
        const auto dx = geom.CellSizeArray();
        const Box& bx = levelset.box();
        const auto blo = amrex::lbound(bounding_box);
        const auto bhi = amrex::ubound(bounding_box);

        const auto& a = levelset.array();
        amrex::LoopOnCpu(bx, [&] (int i, int j, int k) noexcept
        {
            a(i,j,k) = m_f(RealArray{AMREX_D_DECL(problo[0]+amrex::Clamp(i,blo.x,bhi.x)*dx[0],
                                                  problo[1]+amrex::Clamp(j,blo.y,bhi.y)*dx[1],
                                                  problo[2]+amrex::Clamp(k,blo.z,bhi.z)*dx[2])});
        });
    }